

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O3

bool Kernel::Rebalancing::Inverters::nonZero<Kernel::NumTraits<Kernel::RealConstantType>>
               (TermList *t)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  Symbol *pSVar4;
  Symbol *pSVar5;
  Symbol *pSVar6;
  int local_68 [2];
  RealConstantType local_60;
  RealConstantType local_40;
  
  uVar3 = t->_content;
  if ((uVar3 & 3) == 0) {
    pSVar4 = *(Symbol **)(*(long *)(DAT_00b521b0 + 0x60) + (ulong)*(uint *)(uVar3 + 8) * 8);
    bVar2 = Signature::Symbol::numeralConstant(pSVar4,(RealConstantType *)0x0);
    pSVar4 = pSVar4 + 1;
    if (!bVar2) {
      pSVar4 = (Symbol *)0x0;
    }
    uVar3 = t->_content;
    if ((uVar3 & 3) == 0) goto LAB_005a5440;
    if (!bVar2) {
      return false;
    }
    pSVar6 = (Symbol *)0x0;
LAB_005a5472:
    pSVar5 = pSVar6;
    RealConstantType::RealConstantType(&local_40,(RealConstantType *)pSVar4);
    local_68[1] = 0;
    bVar2 = operator!=(&local_40,local_68 + 1);
    if (bVar2) {
      bVar2 = true;
      goto LAB_005a54f3;
    }
    if (pSVar5 == (Symbol *)0x0) {
      bVar2 = false;
      goto LAB_005a54f3;
    }
    bVar1 = false;
  }
  else {
    if ((uVar3 & 3) != 0) {
      return false;
    }
    pSVar4 = (Symbol *)0x0;
LAB_005a5440:
    pSVar5 = *(Symbol **)(*(long *)(DAT_00b521b0 + 0x60) + (ulong)*(uint *)(uVar3 + 8) * 8);
    bVar2 = Signature::Symbol::numeralConstant(pSVar5,(RealConstantType *)0x0);
    pSVar5 = pSVar5 + 1;
    pSVar6 = (Symbol *)0x0;
    if (bVar2) {
      pSVar6 = pSVar5;
    }
    if (pSVar4 != (Symbol *)0x0) goto LAB_005a5472;
    bVar1 = true;
    if (!bVar2) {
      return false;
    }
  }
  RealConstantType::RealConstantType(&local_60,(RealConstantType *)pSVar5);
  local_68[0] = 0;
  bVar2 = operator!=(&local_60,local_68);
  mpz_clear(local_60.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_60);
  if (bVar1) {
    return bVar2;
  }
LAB_005a54f3:
  mpz_clear(local_40.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_40);
  return bVar2;
}

Assistant:

bool nonZero(const TermList &t) {
  NumTraits n{};
  auto n1 = n.tryNumeral(t);
  auto n2 = asig(n).tryNumeral(t);
  return ( n1.isSome() && *n1 != 0 ) 
      || ( n2.isSome() && *n2 != 0 );
}